

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis_enc.c
# Opt level: O0

int FastMBAnalyze(VP8EncIterator *it)

{
  VP8EncIterator *in_RDI;
  uint8_t modes [16];
  uint32_t m2;
  uint32_t m;
  uint32_t dc [16];
  int k;
  uint32_t kThreshold;
  int q;
  uint8_t auStackY_78 [20];
  int in_stack_ffffffffffffff9c;
  int iVar1;
  int iVar2;
  uint32_t local_58 [17];
  int local_14;
  int local_10;
  int local_c;
  VP8EncIterator *local_8;
  
  local_c = (int)in_RDI->enc_->config_->quality;
  local_10 = (local_c * 9) / 100 + 8;
  local_8 = in_RDI;
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 4) {
    (*VP8Mean16x4)(local_8->yuv_in_ + (local_14 << 5),local_58 + local_14);
  }
  iVar2 = 0;
  iVar1 = 0;
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    iVar2 = local_58[local_14] + iVar2;
    iVar1 = local_58[local_14] * local_58[local_14] + iVar1;
  }
  if ((uint)(local_10 * iVar1) < (uint)(iVar2 * iVar2)) {
    VP8SetIntra16Mode((VP8EncIterator *)CONCAT44(iVar2,iVar1),in_stack_ffffffffffffff9c);
  }
  else {
    memset(auStackY_78,0,0x10);
    VP8SetIntra4Mode(local_8,auStackY_78);
  }
  return 0;
}

Assistant:

static int FastMBAnalyze(VP8EncIterator* const it) {
  // Empirical cut-off value, should be around 16 (~=block size). We use the
  // [8-17] range and favor intra4 at high quality, intra16 for low quality.
  const int q = (int)it->enc_->config_->quality;
  const uint32_t kThreshold = 8 + (17 - 8) * q / 100;
  int k;
  uint32_t dc[16], m, m2;
  for (k = 0; k < 16; k += 4) {
    VP8Mean16x4(it->yuv_in_ + Y_OFF_ENC + k * BPS, &dc[k]);
  }
  for (m = 0, m2 = 0, k = 0; k < 16; ++k) {
    m += dc[k];
    m2 += dc[k] * dc[k];
  }
  if (kThreshold * m2 < m * m) {
    VP8SetIntra16Mode(it, 0);   // DC16
  } else {
    const uint8_t modes[16] = { 0 };  // DC4
    VP8SetIntra4Mode(it, modes);
  }
  return 0;
}